

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O1

bool __thiscall pm::Rectangle::shadowHit(Rectangle *this,Ray *ray,float *tMin)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if ((this->super_Geometry).castShadows_ != false) {
    fVar10 = (this->point_).x;
    fVar12 = (this->point_).y;
    fVar13 = (ray->o).x;
    fVar1 = (ray->o).y;
    fVar11 = (this->point_).z;
    fVar2 = (ray->o).z;
    fVar9 = (this->normal_).x;
    fVar3 = (this->normal_).y;
    fVar4 = (this->normal_).z;
    fVar5 = (ray->d).x;
    fVar6 = (ray->d).y;
    fVar7 = (ray->d).z;
    fVar9 = ((fVar11 - fVar2) * fVar4 + (fVar10 - fVar13) * fVar9 + (fVar12 - fVar1) * fVar3) /
            (fVar4 * fVar7 + fVar9 * fVar5 + fVar3 * fVar6);
    if (1e-09 < fVar9) {
      fVar10 = (fVar13 + fVar5 * fVar9) - fVar10;
      fVar12 = (fVar1 + fVar6 * fVar9) - fVar12;
      fVar11 = (fVar2 + fVar7 * fVar9) - fVar11;
      fVar13 = (this->a_).z * fVar11 + (this->a_).x * fVar10 + (this->a_).y * fVar12;
      bVar8 = false;
      if ((0.0 <= fVar13) && (fVar13 < this->aSquaredLength_ || fVar13 == this->aSquaredLength_)) {
        fVar10 = fVar11 * (this->b_).z + fVar10 * (this->b_).x + fVar12 * (this->b_).y;
        bVar8 = false;
        if ((0.0 <= fVar10) && (fVar10 < this->bSquaredLength_ || fVar10 == this->bSquaredLength_))
        {
          *tMin = fVar9;
          bVar8 = true;
        }
      }
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool Rectangle::shadowHit(const Ray &ray, float &tMin) const
{
	if (castShadows_ == false)
		return false;

	float t = dot((point_ - ray.o), normal_) / dot(ray.d, normal_);

	if (t <= Epsilon)
		return false;

	Vector3 p = ray.o + t * ray.d;
	Vector3 d = p - point_;

	const float dDotA = dot(d, a_);
	if (dDotA < 0.0f || dDotA > aSquaredLength_)
		return false;

	const float dDotB = dot(d, b_);
	if (dDotB < 0.0f || dDotB > bSquaredLength_)
		return false;

	tMin = t;

	return true;
}